

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_file_scanner.cpp
# Opt level: O2

void __thiscall
duckdb::CSVFileScan::SetNamesAndTypes
          (CSVFileScan *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names_p,vector<duckdb::LogicalType,_true> *types_p)

{
  vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
  vStack_38;
  
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&this->names,
              &names_p->
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
            (&(this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &types_p->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  MultiFileColumnDefinition::ColumnsFromNamesAndTypes
            ((vector<duckdb::MultiFileColumnDefinition,_true> *)&vStack_38,&this->names,&this->types
            );
  ::std::
  vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>::
  _M_move_assign(&(this->super_BaseFileReader).columns.
                  super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                 ,&vStack_38);
  ::std::
  vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>::
  ~vector(&vStack_38);
  return;
}

Assistant:

void CSVFileScan::SetNamesAndTypes(const vector<string> &names_p, const vector<LogicalType> &types_p) {
	names = names_p;
	types = types_p;
	columns = MultiFileColumnDefinition::ColumnsFromNamesAndTypes(names, types);
}